

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::LE_Fire_PDU::operator==(LE_Fire_PDU *this,LE_Fire_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if (((((!KVar1) && ((this->m_FireFlagUnion).m_ui8Flag == (Value->m_FireFlagUnion).m_ui8Flag)) &&
       (KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=(&this->m_TargetID,&Value->m_TargetID),
       !KVar1)) &&
      ((KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=(&this->m_MunitionID,&Value->m_MunitionID)
       , !KVar1 &&
       (KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID),
       !KVar1)))) &&
     ((KVar1 = DATA_TYPE::MunitionDescriptor::operator!=
                         (&this->m_MunitionDesc,&Value->m_MunitionDesc), !KVar1 &&
      ((KVar1 = DATA_TYPE::RelativeWorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc), !KVar1
       && (KVar1 = DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::
                   operator!=(&this->m_Vel,&Value->m_Vel), !KVar1)))))) {
    return this->m_ui16Range == Value->m_ui16Range;
  }
  return false;
}

Assistant:

KBOOL LE_Fire_PDU::operator == ( const LE_Fire_PDU & Value ) const
{
    if( LE_Header::operator       != ( Value ) )                       return false;
    if( m_FireFlagUnion.m_ui8Flag != Value.m_FireFlagUnion.m_ui8Flag ) return false;
    if( m_TargetID                != Value.m_TargetID )                return false;
    if( m_MunitionID              != Value.m_MunitionID )              return false;
    if( m_EventID                 != Value.m_EventID )                 return false;
    if( m_MunitionDesc            != Value.m_MunitionDesc )            return false;
    if( m_Loc                     != Value.m_Loc )                     return false;
    if( m_Vel                     != Value.m_Vel )                     return false;
    if( m_ui16Range               != Value.m_ui16Range )               return false;
    return true;
}